

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O3

token * __thiscall
argo::pointer::translate_jsonp_token
          (token *__return_storage_ptr__,pointer *this,string *pointer,size_t *start,size_t *end)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  size_t sVar4;
  pointer pcVar5;
  byte bVar6;
  ulong uVar7;
  json_pointer_exception *this_00;
  string translated;
  string local_50;
  
  paVar2 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  sVar4 = *start;
  uVar7 = sVar4 + 1;
  *start = uVar7;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  if ((pointer->_M_dataplus)._M_p[sVar4] == '/') {
    if (uVar7 < *end) {
      do {
        pcVar5 = (pointer->_M_dataplus)._M_p;
        uVar1 = uVar7 + 1;
        cVar3 = pcVar5[uVar7];
        *start = uVar1;
        if (cVar3 == '~') {
          if (*end <= uVar1) goto LAB_0011c52c;
          bVar6 = 0x2f;
          if (pcVar5[uVar1] != '1') {
            if (pcVar5[uVar1] != '0') goto LAB_0011c52c;
            bVar6 = 0x7e;
          }
          this = (pointer *)(ulong)bVar6;
          std::__cxx11::string::push_back((char)&local_50);
          uVar7 = *start + 1;
          *start = uVar7;
        }
        else {
          this = (pointer *)(ulong)(uint)(int)pcVar5[uVar7];
          std::__cxx11::string::push_back((char)&local_50);
          uVar7 = *start;
        }
      } while (uVar7 < *end);
    }
    make_token(__return_storage_ptr__,this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
LAB_0011c52c:
  this_00 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
  json_pointer_exception::json_pointer_exception
            (this_00,syntax_error_in_pointer_string_e,(int)*start + -1);
  __cxa_throw(this_00,&json_pointer_exception::typeinfo,std::exception::~exception);
}

Assistant:

pointer::token pointer::translate_jsonp_token(const string &pointer, size_t &start, size_t &end)
{
    string translated;

    if (pointer[start++] == '/')
    {
        while (start < end)
        {
            if (pointer[start] == '~')
            {
                if (++start < end)
                {
                    if (pointer[start] == '0')
                    {
                        translated += '~';
                    }
                    else if (pointer[start] == '1')
                    {
                        translated += '/';
                    }
                    else
                    {
                        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                    }
                    start++;
                }
                else
                {
                    throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                }
            }
            else
            {
                translated += pointer[start++];
            }
        }

        return make_token(translated);
    }
    else
    {
        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
    }
}